

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O3

void prf_messages_exit(void)

{
  prf_msg_handler_t *ppVar1;
  prf_msg_handler_t **pppVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = prf_array_count(prf_handlers[1]);
  pppVar2 = prf_handlers[1];
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      ppVar1 = pppVar2[uVar4];
      if (ppVar1 != (prf_msg_handler_t *)0x0) {
        free(ppVar1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  prf_array_free(pppVar2);
  uVar3 = prf_array_count(prf_handlers[2]);
  pppVar2 = prf_handlers[2];
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      ppVar1 = pppVar2[uVar4];
      if (ppVar1 != (prf_msg_handler_t *)0x0) {
        free(ppVar1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  prf_array_free(pppVar2);
  uVar3 = prf_array_count(prf_handlers[3]);
  pppVar2 = prf_handlers[3];
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      ppVar1 = pppVar2[uVar4];
      if (ppVar1 != (prf_msg_handler_t *)0x0) {
        free(ppVar1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  prf_array_free(pppVar2);
  uVar3 = prf_array_count(prf_handlers[4]);
  pppVar2 = prf_handlers[4];
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      ppVar1 = pppVar2[uVar4];
      if (ppVar1 != (prf_msg_handler_t *)0x0) {
        free(ppVar1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  prf_array_free(pppVar2);
  uVar3 = prf_array_count(prf_handlers[5]);
  pppVar2 = prf_handlers[5];
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      ppVar1 = pppVar2[uVar4];
      if (ppVar1 != (prf_msg_handler_t *)0x0) {
        free(ppVar1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  prf_array_free(pppVar2);
  return;
}

Assistant:

void
prf_messages_exit(
    void )
{
    int i, count;

    count = prf_array_count( prf_handlers[ PRF_MSG_INFO ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_INFO ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_INFO ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_INFO ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_DEBUG ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_DEBUG ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_DEBUG ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_DEBUG ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_WARNING ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_WARNING ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_WARNING ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_WARNING ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_ERROR ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_ERROR ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_ERROR ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_ERROR ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_FATAL_ERROR ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_FATAL_ERROR ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_FATAL_ERROR ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_FATAL_ERROR ] );
}